

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spng.c
# Opt level: O0

int write_chunk(spng_ctx *ctx,uint8_t *type,void *data,size_t length)

{
  uchar *puStack_38;
  int ret;
  uchar *write_ptr;
  size_t length_local;
  void *data_local;
  uint8_t *type_local;
  spng_ctx *ctx_local;
  
  if ((ctx == (spng_ctx *)0x0) || (type == (uint8_t *)0x0)) {
    ctx_local._4_4_ = 0x50;
  }
  else if ((length == 0) || (data != (void *)0x0)) {
    write_ptr = (uchar *)length;
    length_local = (size_t)data;
    data_local = type;
    type_local = (uint8_t *)ctx;
    ctx_local._4_4_ = write_header(ctx,type,length,&stack0xffffffffffffffc8);
    if (ctx_local._4_4_ == 0) {
      if (write_ptr != (uchar *)0x0) {
        memcpy(puStack_38,(void *)length_local,(size_t)write_ptr);
      }
      ctx_local._4_4_ = finish_chunk((spng_ctx *)type_local);
    }
  }
  else {
    ctx_local._4_4_ = 0x50;
  }
  return ctx_local._4_4_;
}

Assistant:

static int write_chunk(spng_ctx *ctx, const uint8_t type[4], const void *data, size_t length)
{
    if(ctx == NULL || type == NULL) return SPNG_EINTERNAL;
    if(length && data == NULL) return SPNG_EINTERNAL;

    unsigned char *write_ptr;

    int ret = write_header(ctx, type, length, &write_ptr);
    if(ret) return ret;

    if(length) memcpy(write_ptr, data, length);

    return finish_chunk(ctx);
}